

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::FindKnownExtensionByName
          (GeneratedMessageReflection *this,string *name)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  Descriptor *pDVar3;
  ulong uVar4;
  Descriptor *pDVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  if (this->extensions_offset_ == -1) {
    return (FieldDescriptor *)0x0;
  }
  pFVar1 = DescriptorPool::FindExtensionByName(this->descriptor_pool_,name);
  if ((pFVar1 == (FieldDescriptor *)0x0) || (*(Descriptor **)(pFVar1 + 0x38) != this->descriptor_))
  {
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
      pDVar2 = DescriptorPool::FindMessageTypeByName(this->descriptor_pool_,name);
      pDVar3 = pDVar2;
      if (pDVar2 == (Descriptor *)0x0) {
        bVar7 = true;
      }
      else {
        uVar4 = (ulong)*(int *)(pDVar2 + 0x68);
        bVar7 = (long)uVar4 < 1;
        if (0 < (long)uVar4) {
          pDVar5 = *(Descriptor **)(pDVar2 + 0x70);
          uVar6 = 1;
          do {
            if ((((*(Descriptor **)(pDVar5 + 0x38) == this->descriptor_) &&
                 (*(int *)(pDVar5 + 0x2c) == 0xb)) && (*(int *)(pDVar5 + 0x30) == 1)) &&
               (*(Descriptor **)(pDVar5 + 0x48) == pDVar2)) {
              bVar8 = false;
              pDVar3 = pDVar5;
            }
            else {
              bVar8 = true;
            }
            if (!bVar8) break;
            bVar7 = uVar4 <= uVar6;
            pDVar5 = pDVar5 + 0x78;
            bVar8 = uVar6 != uVar4;
            uVar6 = uVar6 + 1;
          } while (bVar8);
        }
      }
      if (!bVar7) {
        return (FieldDescriptor *)pDVar3;
      }
    }
    pFVar1 = (FieldDescriptor *)0x0;
  }
  return pFVar1;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::FindKnownExtensionByName(
    const string& name) const {
  if (extensions_offset_ == -1) return NULL;

  const FieldDescriptor* result = descriptor_pool_->FindExtensionByName(name);
  if (result != NULL && result->containing_type() == descriptor_) {
    return result;
  }

  if (descriptor_->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = descriptor_pool_->FindMessageTypeByName(name);
    if (type != NULL) {
      // Look for a matching extension in the foreign type's scope.
      for (int i = 0; i < type->extension_count(); i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == descriptor_ &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }

  return NULL;
}